

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

void * xmlNanoFTPConnectTo(char *server,int port)

{
  int iVar1;
  char *pcVar2;
  int res;
  xmlNanoFTPCtxtPtr ctxt;
  int port_local;
  char *server_local;
  
  xmlNanoFTPInit();
  if (server == (char *)0x0) {
    server_local = (char *)0x0;
  }
  else if (port < 1) {
    server_local = (char *)0x0;
  }
  else {
    server_local = (char *)xmlNanoFTPNewCtxt((char *)0x0);
    if (server_local == (char *)0x0) {
      server_local = (char *)0x0;
    }
    else {
      pcVar2 = (*xmlMemStrdup)(server);
      *(char **)(server_local + 8) = pcVar2;
      if (*(long *)(server_local + 8) == 0) {
        xmlNanoFTPFreeCtxt(server_local);
        server_local = (char *)0x0;
      }
      else {
        *(int *)(server_local + 0x10) = port;
        iVar1 = xmlNanoFTPConnect(server_local);
        if (iVar1 < 0) {
          xmlNanoFTPFreeCtxt(server_local);
          server_local = (char *)0x0;
        }
      }
    }
  }
  return server_local;
}

Assistant:

void*
xmlNanoFTPConnectTo(const char *server, int port) {
    xmlNanoFTPCtxtPtr ctxt;
    int res;

    xmlNanoFTPInit();
    if (server == NULL)
	return(NULL);
    if (port <= 0)
	return(NULL);
    ctxt = (xmlNanoFTPCtxtPtr) xmlNanoFTPNewCtxt(NULL);
    if (ctxt == NULL)
        return(NULL);
    ctxt->hostname = xmlMemStrdup(server);
    if (ctxt->hostname == NULL) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    ctxt->port = port;
    res = xmlNanoFTPConnect(ctxt);
    if (res < 0) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}